

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O3

char * crn_get_mip_filter_name(crn_mip_filter f)

{
  if (f < cCRNMipFilterTotal) {
    return &DAT_001ad214 + *(int *)(&DAT_001ad214 + (ulong)f * 4);
  }
  return "?";
}

Assistant:

const char* crn_get_mip_filter_name(crn_mip_filter f)
{
    switch (f)
    {
    case cCRNMipFilterBox:
        return "box";
    case cCRNMipFilterTent:
        return "tent";
    case cCRNMipFilterLanczos4:
        return "lanczos4";
    case cCRNMipFilterMitchell:
        return "mitchell";
    case cCRNMipFilterKaiser:
        return "kaiser";
    default:
        break;
    }
    return "?";
}